

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O3

void __thiscall SmallArray<char,_128U>::grow(SmallArray<char,_128U> *this,uint newSize)

{
  Allocator *pAVar1;
  char *pcVar2;
  uint uVar3;
  int iVar4;
  undefined4 extraout_var;
  char *pcVar5;
  ulong uVar6;
  uint uVar7;
  
  uVar7 = (this->max >> 1) + this->max;
  uVar3 = newSize + 4;
  if (newSize < uVar7) {
    uVar3 = uVar7;
  }
  pAVar1 = this->allocator;
  if (pAVar1 == (Allocator *)0x0) {
    pcVar5 = (char *)(*(code *)NULLC::alloc)(uVar3 + 4);
  }
  else {
    iVar4 = (*pAVar1->_vptr_Allocator[2])(pAVar1,(ulong)(uVar3 + 4));
    pcVar5 = (char *)CONCAT44(extraout_var,iVar4);
  }
  if (this->count != 0) {
    uVar6 = 0;
    do {
      pcVar5[uVar6] = this->data[uVar6];
      uVar6 = uVar6 + 1;
    } while (uVar6 < this->count);
  }
  pcVar2 = this->data;
  if (pcVar2 != this->little) {
    if (this->allocator == (Allocator *)0x0) {
      if (pcVar2 != (char *)0x0) {
        (*(code *)NULLC::dealloc)(pcVar2);
      }
    }
    else if (pcVar2 != (char *)0x0) {
      (*this->allocator->_vptr_Allocator[3])();
    }
  }
  this->data = pcVar5;
  this->max = uVar3;
  return;
}

Assistant:

void grow(unsigned newSize)
	{
		if(max + (max >> 1) > newSize)
			newSize = max + (max >> 1);
		else
			newSize += 4;

		T* newData = 0;
		
		if(allocator)
			newData = allocator->construct<T>(newSize);
		else
			newData = NULLC::construct<T>(newSize);

		for(unsigned i = 0; i < count; i++)
			newData[i] = data[i];

		if(data != little)
		{
			if(allocator)
				allocator->destruct(data, max);
			else
				NULLC::destruct(data, max);
		}

		data = newData;

		max = newSize;
	}